

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

bool __thiscall
lunasvg::SVGEnumeration<lunasvg::LengthAdjust>::parseEnum<2u>
          (SVGEnumeration<lunasvg::LengthAdjust> *this,string_view input,
          SVGEnumerationEntry<lunasvg::LengthAdjust> (*entries) [2])

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  SVGEnumerationEntry<lunasvg::LengthAdjust> (*__range2) [2];
  size_t sVar4;
  size_type __rlen;
  long lVar5;
  size_t __n;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  
  pbVar3 = (byte *)input._M_str;
  sVar4 = input._M_len;
  if (sVar4 == 0) {
    __n = 0;
    pbVar7 = pbVar3;
  }
  else {
    pbVar7 = pbVar3 + sVar4;
    lVar2 = -sVar4;
    __n = 0;
    pbVar6 = pbVar3;
    do {
      if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) {
        lVar5 = 0;
        goto LAB_00120668;
      }
      pbVar6 = pbVar6 + 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
  }
  goto LAB_0012068e;
  while (bVar8 = lVar2 + 1 != lVar5, lVar5 = lVar5 + -1, bVar8) {
LAB_00120668:
    pbVar7 = pbVar6;
    if ((0x20 < (ulong)pbVar3[lVar5 + (sVar4 - 1)]) ||
       ((0x100002600U >> ((ulong)pbVar3[lVar5 + (sVar4 - 1)] & 0x3f) & 1) == 0)) {
      __n = lVar5 - lVar2;
      goto LAB_0012068e;
    }
  }
  __n = 0;
LAB_0012068e:
  lVar2 = 0x10;
  while ((__n != *(size_t *)((long)&entries[-1][1].second._M_str + lVar2) ||
         ((__n != 0 &&
          (iVar1 = bcmp(pbVar7,*(void **)(&(*entries)[0].first + lVar2),__n), iVar1 != 0))))) {
    lVar2 = lVar2 + 0x18;
    if (lVar2 == 0x40) {
      return false;
    }
  }
  (this->super_SVGProperty).field_0x9 = *(undefined1 *)((long)&entries[-1][1].second._M_len + lVar2)
  ;
  return true;
}

Assistant:

bool SVGEnumeration<Enum>::parseEnum(std::string_view input, const SVGEnumerationEntry<Enum>(&entries)[N])
{
    stripLeadingAndTrailingSpaces(input);
    for(const auto& entry : entries) {
        if(input == entry.second) {
            m_value = entry.first;
            return true;
        }
    }

    return false;
}